

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUUtils.cpp
# Opt level: O0

String * COLLADABU::Utils::replaceDot(String *text)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RSI;
  String *in_RDI;
  size_t i;
  stringstream stream;
  ulong local_1a0;
  stringstream local_198 [16];
  ostream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 <= local_1a0) break;
    pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
    if (*pcVar2 == '.') {
      std::operator<<(local_188,'_');
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
      std::operator<<(local_188,*pcVar2);
    }
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

String Utils::replaceDot ( const String &text )
    {
        std::stringstream stream;

        for ( size_t i = 0; i < text.length(); ++i )
        {
            if ( text[i] == '.' )
                stream << '_';
            else
                stream << text[i];
        }

        return stream.str();
    }